

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O1

void yy_pop_parser_stack(yyParser *pParser)

{
  yyStackEntry *pyVar1;
  undefined8 in_RAX;
  
  pyVar1 = pParser->yytos;
  if (pyVar1 == (yyStackEntry *)0x0) {
    __assert_fail("pParser->yytos!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O1/calculator.c"
                  ,0x248,"void yy_pop_parser_stack(yyParser *)");
  }
  if (pParser->yystack < pyVar1) {
    pParser->yytos = pyVar1 + -1;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sPopping %s\n",yyTracePrompt,yyTokenName[pyVar1->major],in_RAX);
      return;
    }
    return;
  }
  __assert_fail("pParser->yytos > pParser->yystack",
                "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O1/calculator.c"
                ,0x249,"void yy_pop_parser_stack(yyParser *)");
}

Assistant:

static void yy_pop_parser_stack(yyParser *pParser){
  yyStackEntry *yytos;
  assert( pParser->yytos!=0 );
  assert( pParser->yytos > pParser->yystack );
  yytos = pParser->yytos--;
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yy_destructor(pParser, yytos->major, &yytos->minor);
}